

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_schnorrsig_compute_sigpoint
              (secp256k1_context *ctx,secp256k1_pubkey *sigpoint,uchar *msg32,
              secp256k1_xonly_pubkey *rx,secp256k1_xonly_pubkey *pubkey)

{
  int iVar1;
  secp256k1_ge pubkey_ge;
  uchar pk_buf [32];
  secp256k1_scalar e;
  uchar buf [32];
  uchar rx_buf [32];
  secp256k1_ge nonce_ge;
  secp256k1_ge_storage s;
  secp256k1_ge sigpoint_ge;
  secp256k1_sha256 sha;
  secp256k1_gej pubkey_gej;
  secp256k1_gej sigpoint_gej;
  secp256k1_ge local_370;
  uchar local_318 [32];
  secp256k1_scalar local_2f8;
  uchar local_2d8 [32];
  uchar local_2b8 [40];
  secp256k1_ge local_290;
  secp256k1_ge_storage local_238;
  secp256k1_ge local_1f8;
  secp256k1_sha256 local_1a0;
  secp256k1_gej local_138;
  secp256k1_gej local_b0;
  
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    secp256k1_schnorrsig_compute_sigpoint_cold_4();
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_schnorrsig_compute_sigpoint_cold_3();
  }
  else if (rx == (secp256k1_xonly_pubkey *)0x0) {
    secp256k1_schnorrsig_compute_sigpoint_cold_2();
  }
  else {
    if (pubkey != (secp256k1_xonly_pubkey *)0x0) {
      secp256k1_xonly_pubkey_serialize(ctx,local_318,pubkey);
      secp256k1_xonly_pubkey_serialize(ctx,local_2b8,rx);
      local_1a0.s[0] = 0x9cecba11;
      local_1a0.s[1] = 0x23925381;
      local_1a0.s[2] = 0x11679112;
      local_1a0.s[3] = 0xd1627e0f;
      local_1a0.s[4] = 0x97c87550;
      local_1a0.s[5] = 0x3cc765;
      local_1a0.s[6] = 0x90f61164;
      local_1a0.s[7] = 0x33e9b66a;
      local_1a0.bytes = 0x40;
      secp256k1_sha256_write(&local_1a0,local_2b8,0x20);
      secp256k1_sha256_write(&local_1a0,local_318,0x20);
      secp256k1_sha256_write(&local_1a0,msg32,0x20);
      secp256k1_sha256_finalize(&local_1a0,local_2d8);
      secp256k1_scalar_set_b32(&local_2f8,local_2d8,(int *)0x0);
      iVar1 = secp256k1_pubkey_load(ctx,&local_370,(secp256k1_pubkey *)pubkey);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_eckey_pubkey_tweak_mul(&ctx->ecmult_ctx,&local_370,&local_2f8);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_pubkey_load(ctx,&local_290,(secp256k1_pubkey *)rx);
      if (iVar1 == 0) {
        return 0;
      }
      local_138.infinity = local_370.infinity;
      local_138.x.n[0] = local_370.x.n[0];
      local_138.x.n[1] = local_370.x.n[1];
      local_138.x.n[2] = local_370.x.n[2];
      local_138.x.n[3] = local_370.x.n[3];
      local_138.x.n[4] = local_370.x.n[4];
      local_138.y.n[0] = local_370.y.n[0];
      local_138.y.n[1] = local_370.y.n[1];
      local_138.y.n[2] = local_370.y.n[2];
      local_138.y.n[3] = local_370.y.n[3];
      local_138.y.n[4] = local_370.y.n[4];
      local_138.z.n[0] = 1;
      local_138.z.n[1] = 0;
      local_138.z.n[2] = 0;
      local_138.z.n[3] = 0;
      local_138.z.n[4] = 0;
      secp256k1_gej_add_ge(&local_b0,&local_138,&local_290);
      secp256k1_ge_set_gej(&local_1f8,&local_b0);
      secp256k1_ge_to_storage(&local_238,&local_1f8);
      *(uint64_t *)(sigpoint->data + 0x30) = local_238.y.n[2];
      *(uint64_t *)(sigpoint->data + 0x38) = local_238.y.n[3];
      *(uint64_t *)(sigpoint->data + 0x20) = local_238.y.n[0];
      *(uint64_t *)(sigpoint->data + 0x28) = local_238.y.n[1];
      *(uint64_t *)(sigpoint->data + 0x10) = local_238.x.n[2];
      *(uint64_t *)(sigpoint->data + 0x18) = local_238.x.n[3];
      *(uint64_t *)sigpoint->data = local_238.x.n[0];
      *(uint64_t *)(sigpoint->data + 8) = local_238.x.n[1];
      return 1;
    }
    secp256k1_schnorrsig_compute_sigpoint_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_schnorrsig_compute_sigpoint(const secp256k1_context* ctx, secp256k1_pubkey *sigpoint, const unsigned char *msg32, const secp256k1_xonly_pubkey *rx, const secp256k1_xonly_pubkey *pubkey) {
    unsigned char pk_buf[32];
    unsigned char rx_buf[32];
    secp256k1_sha256 sha;
    unsigned char buf[32];
    secp256k1_gej pubkey_gej;
    secp256k1_ge pubkey_ge;
    secp256k1_ge nonce_ge;
    secp256k1_scalar e;
    secp256k1_gej sigpoint_gej;
    secp256k1_ge sigpoint_ge;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(rx != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_xonly_pubkey_serialize(ctx, pk_buf, pubkey);
    secp256k1_xonly_pubkey_serialize(ctx, rx_buf, rx);

    /* tagged hash(r.x, pk.x, msg32) */
    secp256k1_schnorrsig_sha256_tagged(&sha);
    secp256k1_sha256_write(&sha, rx_buf, 32);
    secp256k1_sha256_write(&sha, pk_buf, 32);
    secp256k1_sha256_write(&sha, msg32, 32);
    secp256k1_sha256_finalize(&sha, buf);

    secp256k1_scalar_set_b32(&e, buf, NULL);

    if (!secp256k1_xonly_pubkey_load(ctx, &pubkey_ge, pubkey)) {
        return 0;
    }

    if (!secp256k1_eckey_pubkey_tweak_mul(&ctx->ecmult_ctx, &pubkey_ge, &e)) {
        return 0;
    }

    if (!secp256k1_xonly_pubkey_load(ctx, &nonce_ge, rx)) {
        return 0;
    }

    secp256k1_gej_set_ge(&pubkey_gej, &pubkey_ge);
    secp256k1_gej_add_ge(&sigpoint_gej, &pubkey_gej, &nonce_ge);

    secp256k1_ge_set_gej(&sigpoint_ge, &sigpoint_gej);
    secp256k1_pubkey_save(sigpoint, &sigpoint_ge);

    return 1;
}